

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

bool __thiscall
gl4cts::GPUShaderFP64Test9::verifyXFBData
          (GPUShaderFP64Test9 *this,_test_case *test_case,uchar *xfb_data)

{
  ostringstream *poVar1;
  _variable_type _Var2;
  double dVar3;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  _variable_type _Var7;
  uint uVar8;
  ulong uVar9;
  ostream *poVar10;
  size_t sVar11;
  TestError *this_00;
  _variable_type *in_RCX;
  _variable_type type;
  _variable_type type_00;
  _variable_type type_01;
  _variable_type type_02;
  _variable_type type_03;
  _variable_type type_04;
  _variable_type type_05;
  _variable_type type_06;
  ulong uVar12;
  int iVar13;
  bool bVar14;
  uint n_logged_component;
  GPUShaderFP64Test9 *this_01;
  GPUShaderFP64Test9 *this_02;
  int iVar15;
  long lVar16;
  bool bVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  double dVar20;
  double dVar21;
  vector<double,_std::allocator<double>_> reference2;
  vector<double,_std::allocator<double>_> reference1;
  _variable_type matrix_a_type;
  double expected_result_data [16];
  string operation_type_string;
  stringstream log_sstream;
  undefined8 local_448;
  vector<double,_std::allocator<double>_> local_418;
  vector<double,_std::allocator<double>_> local_3f8;
  undefined1 local_3dc [12];
  long local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  string local_3b8 [4];
  undefined1 local_338 [8];
  _func_int **local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328 [6];
  ios_base local_2c0 [264];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  uVar5 = Utils::getNumberOfComponentsForVariableType(test_case->result_variable_type);
  uVar12 = (ulong)uVar5;
  iVar15 = 0;
  local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uVar6 = test_case->operation_type - OPERATION_TYPE_PRE_DECREMENTATION;
  if (uVar6 < 4) {
    in_RCX = (_variable_type *)&DAT_01a89460;
    iVar15 = *(int *)(&DAT_01a89460 + (ulong)uVar6 * 4);
  }
  _Var2 = test_case->variable_type;
  if ((_Var2 < VARIABLE_TYPE_UINT) && ((0x7fc03fe0U >> (_Var2 & VARIABLE_TYPE_UINT) & 1) != 0)) {
    _Var7 = Utils::getTransposedMatrixVariableType(_Var2);
    uVar8 = Utils::getNumberOfComponentsForVariableType(_Var2);
    uVar6 = Utils::getNumberOfComponentsForVariableType(_Var7);
    iVar13 = iVar15;
    do {
      iVar13 = iVar13 + 1;
      local_1b8._0_8_ = (undefined8)iVar13;
      if (local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_3f8,
                   (iterator)
                   local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)local_1b8);
      }
      else {
        *local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = (double)local_1b8._0_8_;
        local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
    do {
      uVar6 = uVar6 - 1;
      local_1b8._0_8_ = (undefined8)uVar6;
      if (local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        this_01 = (GPUShaderFP64Test9 *)
                  local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_418,
                   (iterator)
                   local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)local_1b8);
      }
      else {
        *local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = (double)local_1b8._0_8_;
        this_01 = (GPUShaderFP64Test9 *)
                  (local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1);
        local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)this_01;
      }
    } while (uVar6 != 0);
  }
  else {
    uVar6 = uVar5;
    iVar13 = iVar15;
    do {
      iVar13 = iVar13 + 1;
      uVar6 = uVar6 - 1;
      local_1b8._0_8_ = (undefined8)iVar13;
      if (local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_3f8,
                   (iterator)
                   local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)local_1b8);
      }
      else {
        *local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = (double)local_1b8._0_8_;
        local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_1b8._0_8_ = (undefined8)uVar6;
      if (local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        this_01 = (GPUShaderFP64Test9 *)
                  local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_418,
                   (iterator)
                   local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)local_1b8);
      }
      else {
        *local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = (double)local_1b8._0_8_;
        this_01 = (GPUShaderFP64Test9 *)
                  (local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1);
        local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)this_01;
      }
    } while (uVar6 != 0);
  }
  if (((test_case->operation_type == OPERATION_TYPE_MULTIPLICATION) &&
      (_Var2 = test_case->variable_type, _Var2 < VARIABLE_TYPE_UINT)) &&
     ((0x7fc03fe0U >> (_Var2 & VARIABLE_TYPE_UINT) & 1) != 0)) {
    this_02 = (GPUShaderFP64Test9 *)(ulong)_Var2;
    local_3dc._0_4_ = _Var2;
    _Var7 = Utils::getTransposedMatrixVariableType(_Var2);
    this_01 = (GPUShaderFP64Test9 *)local_3dc;
    getMatrixMultiplicationResult
              (this_02,(_variable_type *)this_01,&local_3f8,in_RCX,&local_418,(double *)local_3b8);
    uVar9 = 0;
LAB_009514e5:
    dVar21 = *(double *)(xfb_data + uVar9 * 8) - (double)(&local_3b8[0]._M_dataplus)[uVar9]._M_p;
    dVar20 = -dVar21;
    if (-dVar21 <= dVar21) {
      dVar20 = dVar21;
    }
    if (dVar20 <= 1e-05) goto code_r0x00951509;
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Data returned for ",0x12);
    Utils::getVariableTypeString_abi_cxx11_((string *)local_338,(Utils *)(ulong)_Var2,type_00);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)local_338,(long)local_330);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," * ",3);
    Utils::getVariableTypeString_abi_cxx11_((string *)(local_3dc + 4),(Utils *)(ulong)_Var7,type_01)
    ;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)local_3dc._4_8_,local_3d0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," matrix multiplication was incorrect; expected:(",0x30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3dc._4_8_ != &local_3c8) {
      operator_delete((void *)local_3dc._4_8_,local_3c8._M_allocated_capacity + 1);
    }
    if (local_338 != (undefined1  [8])local_328) {
      operator_delete((void *)local_338,local_328[0]._M_allocated_capacity + 1);
    }
    uVar9 = 0;
    do {
      std::ostream::_M_insert<double>((double)(&local_3b8[0]._M_dataplus)[uVar9]._M_p);
      if (uVar5 - 1 != uVar9) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      uVar9 = uVar9 + 1;
    } while (uVar12 != uVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"), retrieved:(",0xe);
    uVar9 = 0;
    do {
      std::ostream::_M_insert<double>(*(double *)(xfb_data + uVar9 * 8));
      if (uVar5 - 1 != uVar9) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      uVar9 = uVar9 + 1;
    } while (uVar12 != uVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
    local_338 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
    std::__cxx11::stringbuf::str();
    uVar4 = local_3dc._4_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3dc._4_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_330 + (int)local_330[-3]);
    }
    else {
      sVar11 = strlen((char *)local_3dc._4_8_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,(char *)uVar4,sVar11)
      ;
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3dc._4_8_ != &local_3c8) {
      operator_delete((void *)local_3dc._4_8_,local_3c8._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330);
    std::ios_base::~ios_base(local_2c0);
    this_01 = (GPUShaderFP64Test9 *)&std::__cxx11::stringstream::VTT;
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    bVar14 = false;
    goto LAB_0095199a;
  }
  poVar1 = (ostringstream *)(local_1b8 + 8);
  bVar14 = true;
  lVar16 = 0;
  do {
    if (OPERATION_TYPE_POST_INCREMENTATION < test_case->operation_type) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized operation type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x2e6e);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    dVar20 = local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar16];
    switch(test_case->operation_type) {
    case OPERATION_TYPE_ADDITION:
      dVar20 = dVar20 + local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar16];
      break;
    case OPERATION_TYPE_DIVISION:
      dVar20 = dVar20 / local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar16];
      break;
    case OPERATION_TYPE_MULTIPLICATION:
      dVar20 = dVar20 * local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar16];
      break;
    case OPERATION_TYPE_SUBTRACTION:
      dVar20 = dVar20 - local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar16];
      break;
    case OPERATION_TYPE_POST_DECREMENTATION:
    case OPERATION_TYPE_POST_INCREMENTATION:
      dVar20 = dVar20 - (double)iVar15;
    }
    dVar20 = *(double *)(xfb_data + lVar16 * 8) - dVar20;
    dVar21 = (double)((ulong)dVar20 ^ (ulong)DAT_01a89390);
    uVar18 = SUB84(dVar21,0);
    uVar19 = (undefined4)((ulong)dVar21 >> 0x20);
    if (dVar21 <= dVar20) {
      uVar18 = SUB84(dVar20,0);
      uVar19 = (undefined4)((ulong)dVar20 >> 0x20);
    }
    local_448 = (double)CONCAT44(uVar19,uVar18);
    if (1e-05 <= (double)CONCAT44(uVar19,uVar18) && (double)CONCAT44(uVar19,uVar18) != 1e-05) {
      getOperationTypeString_abi_cxx11_((string *)local_338,this_01,&test_case->operation_type);
      Utils::getVariableTypeString_abi_cxx11_
                (local_3b8,(Utils *)(ulong)test_case->variable_type,type);
      local_1b8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Value(s) generated for variable type [",0x26);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,local_3b8[0]._M_dataplus._M_p,local_3b8[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"] and operation type [",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,(char *)local_338,(long)local_330);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"] were found invalid.",0x15);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      this_01 = (GPUShaderFP64Test9 *)&std::__cxx11::ostringstream::VTT;
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x68));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8[0]._M_dataplus._M_p != &local_3b8[0].field_2) {
        this_01 = (GPUShaderFP64Test9 *)(local_3b8[0].field_2._M_allocated_capacity + 1);
        operator_delete(local_3b8[0]._M_dataplus._M_p,(ulong)this_01);
      }
      if (local_338 != (undefined1  [8])local_328) {
        this_01 = (GPUShaderFP64Test9 *)(local_328[0]._M_allocated_capacity + 1);
        operator_delete((void *)local_338,(ulong)this_01);
      }
      bVar14 = false;
    }
  } while ((local_448 <= 1e-05) && (bVar17 = uVar12 - 1 != lVar16, lVar16 = lVar16 + 1, bVar17));
LAB_0095199a:
  if ((test_case->variable_type < VARIABLE_TYPE_UVEC2) &&
     ((0x80060011U >> (test_case->variable_type & VARIABLE_TYPE_UINT) & 1) != 0)) {
    dVar20 = *local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    dVar21 = *local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    dVar3 = (double)(float)dVar21;
    if ((dVar20 < dVar21 == (*(int *)(xfb_data + uVar12 * 8) == 0)) ||
       ((*(int *)(xfb_data + uVar12 * 8 + 4) == 0) == dVar20 < dVar3)) {
      getOperationTypeString_abi_cxx11_((string *)local_338,this_01,&test_case->operation_type);
      Utils::getVariableTypeString_abi_cxx11_
                (local_3b8,(Utils *)(ulong)test_case->variable_type,type_02);
      local_1b8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "Values reported for lower-than operator used for variable type [",0x40);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,local_3b8[0]._M_dataplus._M_p,local_3b8[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"]and operation type [",0x15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,(char *)local_338,(long)local_330);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"]was found invalid; expected:(",0x1e);
      std::ostream::_M_insert<bool>(SUB81(poVar1,0));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::_M_insert<bool>(SUB81(poVar1,0));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"); found:(",10);
      std::ostream::operator<<(poVar1,*(int *)(xfb_data + uVar12 * 8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::operator<<(poVar1,*(int *)(xfb_data + uVar12 * 8 + 4));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,").",2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      this_01 = (GPUShaderFP64Test9 *)&std::__cxx11::ostringstream::VTT;
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x68));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8[0]._M_dataplus._M_p != &local_3b8[0].field_2) {
        this_01 = (GPUShaderFP64Test9 *)(local_3b8[0].field_2._M_allocated_capacity + 1);
        operator_delete(local_3b8[0]._M_dataplus._M_p,(ulong)this_01);
      }
      if (local_338 != (undefined1  [8])local_328) {
        this_01 = (GPUShaderFP64Test9 *)(local_328[0]._M_allocated_capacity + 1);
        operator_delete((void *)local_338,(ulong)this_01);
      }
      bVar14 = false;
    }
    if ((dVar21 < dVar20 == (*(int *)(xfb_data + uVar12 * 8 + 8) != 0)) ||
       (dVar3 < dVar20 == (*(int *)(xfb_data + uVar12 * 8 + 0xc) != 0))) {
      getOperationTypeString_abi_cxx11_((string *)local_338,this_01,&test_case->operation_type);
      Utils::getVariableTypeString_abi_cxx11_
                (local_3b8,(Utils *)(ulong)test_case->variable_type,type_03);
      local_1b8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "Values reported for lower-than-or-equal operator used for variable type [",0x49);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,local_3b8[0]._M_dataplus._M_p,local_3b8[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"]and operation type [",0x15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,(char *)local_338,(long)local_330);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"]was found invalid; expected:(",0x1e);
      std::ostream::_M_insert<bool>(SUB81(poVar1,0));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::_M_insert<bool>(SUB81(poVar1,0));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"); found:(",10);
      std::ostream::operator<<(poVar1,*(int *)(xfb_data + uVar12 * 8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::operator<<(poVar1,*(int *)(xfb_data + uVar12 * 8 + 4));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,").",2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      this_01 = (GPUShaderFP64Test9 *)&std::__cxx11::ostringstream::VTT;
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x68));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8[0]._M_dataplus._M_p != &local_3b8[0].field_2) {
        this_01 = (GPUShaderFP64Test9 *)(local_3b8[0].field_2._M_allocated_capacity + 1);
        operator_delete(local_3b8[0]._M_dataplus._M_p,(ulong)this_01);
      }
      if (local_338 != (undefined1  [8])local_328) {
        this_01 = (GPUShaderFP64Test9 *)(local_328[0]._M_allocated_capacity + 1);
        operator_delete((void *)local_338,(ulong)this_01);
      }
      bVar14 = false;
    }
    if ((dVar20 <= dVar21 == (*(int *)(xfb_data + uVar12 * 8 + 0x10) != 0)) ||
       (dVar20 <= dVar3 == (*(int *)(xfb_data + uVar12 * 8 + 0x14) != 0))) {
      getOperationTypeString_abi_cxx11_((string *)local_338,this_01,&test_case->operation_type);
      Utils::getVariableTypeString_abi_cxx11_
                (local_3b8,(Utils *)(ulong)test_case->variable_type,type_04);
      local_1b8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "Values reported for greater-than operator used for variable type [",0x42);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,local_3b8[0]._M_dataplus._M_p,local_3b8[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"]and operation type [",0x15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,(char *)local_338,(long)local_330);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"]was found invalid; expected:(",0x1e);
      std::ostream::_M_insert<bool>(SUB81(poVar1,0));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::_M_insert<bool>(SUB81(poVar1,0));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"); found:(",10);
      std::ostream::operator<<(poVar1,*(int *)(xfb_data + uVar12 * 8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::operator<<(poVar1,*(int *)(xfb_data + uVar12 * 8 + 4));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,").",2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      this_01 = (GPUShaderFP64Test9 *)&std::__cxx11::ostringstream::VTT;
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x68));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8[0]._M_dataplus._M_p != &local_3b8[0].field_2) {
        this_01 = (GPUShaderFP64Test9 *)(local_3b8[0].field_2._M_allocated_capacity + 1);
        operator_delete(local_3b8[0]._M_dataplus._M_p,(ulong)this_01);
      }
      if (local_338 != (undefined1  [8])local_328) {
        this_01 = (GPUShaderFP64Test9 *)(local_328[0]._M_allocated_capacity + 1);
        operator_delete((void *)local_338,(ulong)this_01);
      }
      bVar14 = false;
    }
    if ((dVar20 < dVar21 != (*(int *)(xfb_data + uVar12 * 8 + 0x18) != 0)) &&
       (dVar20 < dVar3 != (*(int *)(xfb_data + uVar12 * 8 + 0x1c) != 0))) goto LAB_009522ec;
    getOperationTypeString_abi_cxx11_((string *)local_338,this_01,&test_case->operation_type);
    Utils::getVariableTypeString_abi_cxx11_
              (local_3b8,(Utils *)(ulong)test_case->variable_type,type_05);
    local_1b8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Values reported for greater-than-or-equal operator used for variable type [",0x4b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,local_3b8[0]._M_dataplus._M_p,local_3b8[0]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"]and operation type [",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(char *)local_338,(long)local_330);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"]was found invalid; expected:(",0x1e);
    std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"); found:(",10);
    std::ostream::operator<<(poVar1,*(int *)(xfb_data + uVar12 * 8));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::operator<<(poVar1,*(int *)(xfb_data + uVar12 * 8 + 4));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,").",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if ((((*(int *)(xfb_data + uVar12 * 8) == 1) && (*(int *)(xfb_data + uVar12 * 8 + 4) == 1)) &&
        (*(int *)(xfb_data + uVar12 * 8 + 8) == 1)) &&
       ((((*(int *)(xfb_data + uVar12 * 8 + 0xc) == 1 &&
          (*(int *)(xfb_data + uVar12 * 8 + 0x10) == 1)) &&
         (*(int *)(xfb_data + uVar12 * 8 + 0x14) == 1)) &&
        ((*(int *)(xfb_data + uVar12 * 8 + 0x18) == 1 &&
         (*(int *)(xfb_data + uVar12 * 8 + 0x1c) == 1)))))) goto LAB_009522ec;
    getOperationTypeString_abi_cxx11_((string *)local_338,this_01,&test_case->operation_type);
    Utils::getVariableTypeString_abi_cxx11_
              (local_3b8,(Utils *)(ulong)test_case->variable_type,type_06);
    local_1b8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Invalid value was reported for matrix variable type, for which  operator checks are not executed; variable type ["
               ,0x71);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,local_3b8[0]._M_dataplus._M_p,local_3b8[0]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"]and operation type [",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(char *)local_338,(long)local_330);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x68));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != &local_3b8[0].field_2) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if (local_338 != (undefined1  [8])local_328) {
    operator_delete((void *)local_338,local_328[0]._M_allocated_capacity + 1);
  }
  bVar14 = false;
LAB_009522ec:
  if (local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar14;
code_r0x00951509:
  uVar9 = uVar9 + 1;
  if (uVar12 == uVar9) goto code_r0x00951511;
  goto LAB_009514e5;
code_r0x00951511:
  bVar14 = true;
  goto LAB_0095199a;
}

Assistant:

bool GPUShaderFP64Test9::verifyXFBData(const _test_case& test_case, const unsigned char* xfb_data)
{
	const double	   epsilon = 1e-5;
	const unsigned int n_result_components =
		Utils::getNumberOfComponentsForVariableType(test_case.result_variable_type);
	bool		  result			  = true;
	const double* xfb_data_result	 = (const double*)xfb_data;
	const int*	xfb_data_result_lt  = (const int*)(xfb_data_result + n_result_components);
	const int*	xfb_data_result_lte = (const int*)xfb_data_result_lt + 2;  /* cast/non-cast cases */
	const int*	xfb_data_result_gt  = (const int*)xfb_data_result_lte + 2; /* cast/non-cast cases */
	const int*	xfb_data_result_gte = (const int*)xfb_data_result_gt + 2;  /* cast/non-cast cases */

	/* Prepare reference values */
	int					modifier;
	std::vector<double> reference1;
	std::vector<double> reference2;

	if (test_case.operation_type == OPERATION_TYPE_PRE_INCREMENTATION ||
		test_case.operation_type == OPERATION_TYPE_POST_INCREMENTATION)
	{
		modifier = 1;
	}
	else if (test_case.operation_type == OPERATION_TYPE_PRE_DECREMENTATION ||
			 test_case.operation_type == OPERATION_TYPE_POST_DECREMENTATION)
	{
		modifier = -1;
	}
	else
	{
		modifier = 0;
	}

	if (Utils::isMatrixVariableType(test_case.variable_type))
	{
		/* Matrices may be of different sizes so we need to compute the
		 * reference values separately for each matrix
		 */
		const Utils::_variable_type matrix_a_type = test_case.variable_type;
		const Utils::_variable_type matrix_b_type = Utils::getTransposedMatrixVariableType(test_case.variable_type);
		const unsigned int			n_matrix_a_components = Utils::getNumberOfComponentsForVariableType(matrix_a_type);
		const unsigned int			n_matrix_b_components = Utils::getNumberOfComponentsForVariableType(matrix_b_type);

		for (unsigned int n_component = 0; n_component < n_matrix_a_components; ++n_component)
		{
			reference1.push_back(modifier + n_component + 1);
		}

		for (unsigned int n_component = 0; n_component < n_matrix_b_components; ++n_component)
		{
			reference2.push_back(n_matrix_b_components - (n_component + 1));
		}
	} /* if (Utils::isMatrixVariableType(test_case.variable_type) */
	else
	{
		/* Generate as many components as will be expected for the result variable */
		for (unsigned int n_result_component = 0; n_result_component < n_result_components; ++n_result_component)
		{
			reference1.push_back(modifier + n_result_component + 1);
			reference2.push_back(n_result_components - (n_result_component + 1));
		}
	}

	/* Verify the result value(s) */
	if (test_case.operation_type == OPERATION_TYPE_MULTIPLICATION &&
		Utils::isMatrixVariableType(test_case.variable_type))
	{
		/* Matrix multiplication */
		double				  expected_result_data[4 * 4];
		Utils::_variable_type matrix_a_type = test_case.variable_type;
		Utils::_variable_type matrix_b_type = Utils::getTransposedMatrixVariableType(test_case.variable_type);

		getMatrixMultiplicationResult(matrix_a_type, reference1, matrix_b_type, reference2, expected_result_data);

		for (unsigned int n_component = 0; n_component < n_result_components; ++n_component)
		{
			if (de::abs(xfb_data_result[n_component] - expected_result_data[n_component]) > epsilon)
			{
				std::stringstream log_sstream;

				log_sstream << "Data returned for " << Utils::getVariableTypeString(matrix_a_type) << " * "
							<< Utils::getVariableTypeString(matrix_b_type)
							<< " matrix multiplication was incorrect; expected:(";

				for (unsigned int n_logged_component = 0; n_logged_component < n_result_components;
					 ++n_logged_component)
				{
					log_sstream << expected_result_data[n_logged_component];

					if (n_logged_component != (n_result_components - 1))
					{
						log_sstream << ", ";
					}
				} /* for (all components to be logged) */

				log_sstream << "), retrieved:(";

				for (unsigned int n_logged_component = 0; n_logged_component < n_result_components;
					 ++n_logged_component)
				{
					log_sstream << xfb_data_result[n_logged_component];

					if (n_logged_component != (n_result_components - 1))
					{
						log_sstream << ", ";
					}
				} /* for (all components to be logged) */

				log_sstream << ")";

				m_testCtx.getLog() << tcu::TestLog::Message << log_sstream.str().c_str() << tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		} /* for (all result components) */
	}	 /* if (dealing with matrix multiplication) */
	else
	{
		for (unsigned int n_component = 0; n_component < n_result_components; ++n_component)
		{
			double expected_value = reference1[n_component];

			switch (test_case.operation_type)
			{
			case OPERATION_TYPE_ADDITION:
				expected_value += reference2[n_component];
				break;
			case OPERATION_TYPE_DIVISION:
				expected_value /= reference2[n_component];
				break;
			case OPERATION_TYPE_MULTIPLICATION:
				expected_value *= reference2[n_component];
				break;
			case OPERATION_TYPE_SUBTRACTION:
				expected_value -= reference2[n_component];
				break;

			case OPERATION_TYPE_PRE_DECREMENTATION:
			case OPERATION_TYPE_PRE_INCREMENTATION:
			{
				/* Modifier already applied */
				break;
			}

			case OPERATION_TYPE_POST_DECREMENTATION:
			case OPERATION_TYPE_POST_INCREMENTATION:
			{
				/* Need to reverse the modification for the purpose of the following check */
				expected_value -= modifier;

				break;
			}

			default:
			{
				TCU_FAIL("Unrecognized operation type");
			}
			} /* switch (test_case.operation_type) */

			if (de::abs(xfb_data_result[n_component] - expected_value) > epsilon)
			{
				std::string operation_type_string = getOperationTypeString(test_case.operation_type);
				std::string variable_type_string  = Utils::getVariableTypeString(test_case.variable_type);

				m_testCtx.getLog() << tcu::TestLog::Message << "Value(s) generated for variable type ["
								   << variable_type_string << "]"
															  " and operation type ["
								   << operation_type_string << "]"
															   " were found invalid."
								   << tcu::TestLog::EndMessage;

				result = false;
				break;
			} /* if (test case failed) */
		}	 /* for (all components) */
	}

	/* Verify the comparison operation results */
	if (Utils::isScalarVariableType(test_case.variable_type))
	{
		DE_ASSERT(n_result_components == 1);

		const bool expected_result_lt[2]  = { reference1[0] < reference2[0], reference1[0] < (float)reference2[0] };
		const bool expected_result_lte[2] = { reference1[0] <= reference2[0], reference1[0] <= (float)reference2[0] };
		const bool expected_result_gt[2]  = { reference1[0] > reference2[0], reference1[0] > (float)reference2[0] };
		const bool expected_result_gte[2] = { reference1[0] >= reference2[0], reference1[0] >= (float)reference2[0] };

		if ((xfb_data_result_lt[0] ? 1 : 0) != expected_result_lt[0] ||
			(xfb_data_result_lt[1] ? 1 : 0) != expected_result_lt[1])
		{
			std::string operation_type_string = getOperationTypeString(test_case.operation_type);
			std::string variable_type_string  = Utils::getVariableTypeString(test_case.variable_type);

			m_testCtx.getLog() << tcu::TestLog::Message << "Values reported for lower-than operator used for "
														   "variable type ["
							   << variable_type_string << "]"
														  "and operation type ["
							   << operation_type_string << "]"
														   "was found invalid; expected:("
							   << expected_result_lt[0] << ", " << expected_result_lt[1] << "); found:("
							   << xfb_data_result_lt[0] << ", " << xfb_data_result_lt[1] << ")."
							   << tcu::TestLog::EndMessage;

			result = false;
		}

		if ((xfb_data_result_lte[0] ? 1 : 0) != expected_result_lte[0] ||
			(xfb_data_result_lte[1] ? 1 : 0) != expected_result_lte[1])
		{
			std::string operation_type_string = getOperationTypeString(test_case.operation_type);
			std::string variable_type_string  = Utils::getVariableTypeString(test_case.variable_type);

			m_testCtx.getLog() << tcu::TestLog::Message << "Values reported for lower-than-or-equal operator used for "
														   "variable type ["
							   << variable_type_string << "]"
														  "and operation type ["
							   << operation_type_string << "]"
														   "was found invalid; expected:("
							   << expected_result_lt[0] << ", " << expected_result_lt[1] << "); found:("
							   << xfb_data_result_lt[0] << ", " << xfb_data_result_lt[1] << ")."
							   << tcu::TestLog::EndMessage;

			result = false;
		}

		if ((xfb_data_result_gt[0] ? 1 : 0) != expected_result_gt[0] ||
			(xfb_data_result_gt[1] ? 1 : 0) != expected_result_gt[1])
		{
			std::string operation_type_string = getOperationTypeString(test_case.operation_type);
			std::string variable_type_string  = Utils::getVariableTypeString(test_case.variable_type);

			m_testCtx.getLog() << tcu::TestLog::Message << "Values reported for greater-than operator used for "
														   "variable type ["
							   << variable_type_string << "]"
														  "and operation type ["
							   << operation_type_string << "]"
														   "was found invalid; expected:("
							   << expected_result_lt[0] << ", " << expected_result_lt[1] << "); found:("
							   << xfb_data_result_lt[0] << ", " << xfb_data_result_lt[1] << ")."
							   << tcu::TestLog::EndMessage;

			result = false;
		}

		if ((xfb_data_result_gte[0] ? 1 : 0) != expected_result_gte[0] ||
			(xfb_data_result_gte[1] ? 1 : 0) != expected_result_gte[1])
		{
			std::string operation_type_string = getOperationTypeString(test_case.operation_type);
			std::string variable_type_string  = Utils::getVariableTypeString(test_case.variable_type);

			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Values reported for greater-than-or-equal operator used for "
								  "variable type ["
							   << variable_type_string << "]"
														  "and operation type ["
							   << operation_type_string << "]"
														   "was found invalid; expected:("
							   << expected_result_lt[0] << ", " << expected_result_lt[1] << "); found:("
							   << xfb_data_result_lt[0] << ", " << xfb_data_result_lt[1] << ")."
							   << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* if (Utils::isScalarVariableType(test_case.variable_type) ) */
	else
	{
		if (xfb_data_result_lt[0] != 1 || xfb_data_result_lt[1] != 1 || xfb_data_result_lte[0] != 1 ||
			xfb_data_result_lte[1] != 1 || xfb_data_result_gt[0] != 1 || xfb_data_result_gt[1] != 1 ||
			xfb_data_result_gte[0] != 1 || xfb_data_result_gte[1] != 1)
		{
			std::string operation_type_string = getOperationTypeString(test_case.operation_type);
			std::string variable_type_string  = Utils::getVariableTypeString(test_case.variable_type);

			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid value was reported for matrix variable type, for which "
								  " operator checks are not executed; variable type ["
							   << variable_type_string << "]"
														  "and operation type ["
							   << operation_type_string << "]" << tcu::TestLog::EndMessage;

			result = false;
		}
	}

	return result;
}